

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  Atom AVar2;
  Display *pDVar3;
  char *pcVar4;
  size_t sVar5;
  Atom AVar6;
  long lVar7;
  ulong uVar8;
  Window WVar9;
  Atom *pAVar10;
  undefined8 uVar11;
  long local_170;
  ulong local_168;
  XEvent *local_160;
  Window local_158;
  int actualFormat;
  Atom formats [3];
  undefined1 local_128 [8];
  unsigned_long itemCount;
  Atom targets [5];
  undefined4 local_f0 [6];
  Display *local_d8;
  int local_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  Time local_c0;
  Atom local_b8;
  Window local_b0;
  
  AVar6 = 0;
  memset(local_f0,0,0xc0);
  pcVar4 = _glfw.x11.clipboardString;
  pDVar3 = _glfw.x11.display;
  formats[0] = _glfw.x11.UTF8_STRING;
  formats[1] = _glfw.x11.COMPOUND_STRING;
  formats[2] = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_0011b043;
  AVar2 = (event->xselectionrequest).target;
  if (AVar2 == _glfw.x11.TARGETS) {
    pAVar10 = targets;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = _glfw.x11.COMPOUND_STRING;
    targets[4] = 0x1f;
    WVar9 = (event->xkey).root;
    uVar11 = 5;
    AVar6 = 4;
    targets[0] = AVar2;
LAB_0011aefa:
    XChangeProperty(_glfw.x11.display,WVar9,AVar1,AVar6,0x20,0,pAVar10,uVar11);
  }
  else {
    if (AVar2 != _glfw.x11.MULTIPLE) {
      if (AVar2 != _glfw.x11.SAVE_TARGETS) {
        AVar6 = 0;
        lVar7 = 0;
        do {
          if (AVar2 == formats[lVar7]) {
            WVar9 = (event->xkey).root;
            sVar5 = strlen(_glfw.x11.clipboardString);
            XChangeProperty(pDVar3,WVar9,AVar1,AVar2,8,0,pcVar4,sVar5);
            AVar6 = (event->xselectionrequest).property;
            break;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        goto LAB_0011b043;
      }
      WVar9 = (event->xkey).root;
      uVar11 = 0;
      pAVar10 = (Atom *)0x0;
      AVar6 = _glfw.x11.NULL_;
      goto LAB_0011aefa;
    }
    XGetWindowProperty(_glfw.x11.display,(event->xkey).root,AVar1,0,0x7fffffffffffffff,0,
                       _glfw.x11.ATOM_PAIR,targets,&actualFormat,&itemCount,local_128,&local_170);
    local_168 = itemCount;
    if (itemCount != 0) {
      uVar8 = 0;
      local_160 = event;
      do {
        pcVar4 = _glfw.x11.clipboardString;
        pDVar3 = _glfw.x11.display;
        AVar1 = *(Atom *)(local_170 + uVar8 * 8);
        lVar7 = 0;
        do {
          if (AVar1 == formats[lVar7]) {
            local_158 = (event->xkey).root;
            uVar11 = *(undefined8 *)(local_170 + 8 + uVar8 * 8);
            sVar5 = strlen(_glfw.x11.clipboardString);
            event = local_160;
            XChangeProperty(pDVar3,local_158,uVar11,AVar1,8,0,pcVar4,sVar5);
            goto LAB_0011aff3;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        *(undefined8 *)(local_170 + 8 + uVar8 * 8) = 0;
LAB_0011aff3:
        uVar8 = uVar8 + 2;
      } while (uVar8 < local_168);
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0,local_170,local_168);
    XFree(local_170);
  }
  AVar6 = (event->xselectionrequest).property;
LAB_0011b043:
  local_f0[0] = 0x1f;
  local_d8 = (event->xany).display;
  local_d0 = (event->xfocus).mode;
  iStack_cc = (event->xfocus).detail;
  iStack_c8 = (event->xexpose).width;
  iStack_c4 = (event->xexpose).height;
  local_c0 = (event->xkey).time;
  local_b0 = (event->xconfigure).above;
  local_b8 = AVar6;
  XSendEvent(_glfw.x11.display,(event->xkey).root,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply;
    memset(&reply, 0, sizeof(reply));

    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.type = SelectionNotify;
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}